

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O3

Aig_Obj_t ** Dch_ClassesReadClass(Dch_Cla_t *p,Aig_Obj_t *pRepr,int *pnSize)

{
  Aig_Obj_t ***pppAVar1;
  
  pppAVar1 = p->pId2Class;
  if (pppAVar1[pRepr->Id] == (Aig_Obj_t **)0x0) {
    __assert_fail("p->pId2Class[pRepr->Id] != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchClass.c"
                  ,0xe0,"Aig_Obj_t **Dch_ClassesReadClass(Dch_Cla_t *, Aig_Obj_t *, int *)");
  }
  if (1 < p->pClassSizes[pRepr->Id]) {
    *pnSize = p->pClassSizes[pRepr->Id];
    return pppAVar1[pRepr->Id];
  }
  __assert_fail("p->pClassSizes[pRepr->Id] > 1",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchClass.c"
                ,0xe1,"Aig_Obj_t **Dch_ClassesReadClass(Dch_Cla_t *, Aig_Obj_t *, int *)");
}

Assistant:

Aig_Obj_t ** Dch_ClassesReadClass( Dch_Cla_t * p, Aig_Obj_t * pRepr, int * pnSize )
{
    assert( p->pId2Class[pRepr->Id] != NULL );
    assert( p->pClassSizes[pRepr->Id] > 1 );
    *pnSize = p->pClassSizes[pRepr->Id];
    return p->pId2Class[pRepr->Id];
}